

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O1

void __thiscall
soplex::SVSetBase<double>::
add<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
          (SVSetBase<double> *this,
          SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *pset)

{
  Item *sv;
  int n;
  SVectorBase<double> *this_00;
  long lVar1;
  int n_00;
  long lVar2;
  
  n = (pset->set).thenum;
  lVar2 = (long)n;
  if (lVar2 < 1) {
    n_00 = 0;
  }
  else {
    lVar1 = 0;
    n_00 = 0;
    do {
      n_00 = n_00 + (pset->set).theitem[(pset->set).thekey[lVar1].idx].data.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    .memused;
      lVar1 = lVar1 + 1;
    } while (lVar2 != lVar1);
  }
  ensurePSVec(this,n);
  ensureMem(this,n_00,true);
  if (0 < n) {
    lVar1 = 0;
    do {
      sv = (pset->set).theitem + (pset->set).thekey[lVar1].idx;
      this_00 = create(this,(sv->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            .memused);
      SVectorBase<double>::operator=
                (this_00,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)sv);
      lVar1 = lVar1 + 1;
    } while (lVar2 != lVar1);
  }
  return;
}

Assistant:

void add(const SVSetBase<S>& pset)
   {
      int i;
      int n;
      int len;

      n = pset.num();

      for(i = len = 0; i < n; ++i)
         len += pset[i].size();

      ensurePSVec(n);
      ensureMem(len);

      for(i = 0; i < n; ++i)
         *create(pset[i].size()) = pset[i];
   }